

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O1

string * wabt::FormatErrorsToString
                   (string *__return_storage_ptr__,Errors *errors,Type location_type,
                   LexerSourceLineFinder *line_finder,Color *color,string *header,
                   PrintHeader print_header,int source_line_max_length)

{
  int iVar1;
  string *psVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  pointer pEVar7;
  string indent_str;
  PrintHeader local_c4;
  SourceLine local_c0;
  string *local_98;
  Type local_8c;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  Offset local_48;
  LexerSourceLineFinder *local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar7 = (errors->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (errors->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_98 = __return_storage_ptr__;
  if (pEVar7 != local_38) {
    local_c4 = print_header;
    local_48 = (Offset)source_line_max_length;
    local_8c = location_type;
    local_40 = line_finder;
    do {
      psVar2 = local_98;
      if (header->_M_string_length != 0) {
        if (local_c4 != Always) {
          if (local_c4 != Once) goto LAB_0012cf38;
          local_c4 = Never;
        }
        std::__cxx11::string::_M_append((char *)local_98,(ulong)(header->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)psVar2);
      }
LAB_0012cf38:
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,(header->_M_string_length != 0) * '\x02');
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_88 + local_80);
      std::__cxx11::string::append((char *)&local_68);
      if ((pEVar7->loc).filename.size_ != 0) {
        string_view::to_string_abi_cxx11_(&local_c0.line,&(pEVar7->loc).filename);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_c0.line._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.line._M_dataplus._M_p != &local_c0.line.field_2) {
          operator_delete(local_c0.line._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)&local_68);
      }
      if (local_8c == Text) {
        StringPrintf_abi_cxx11_
                  (&local_c0.line,"%d:%d: ",(ulong)(uint)(pEVar7->loc).field_1.field_0.line,
                   (ulong)(uint)(pEVar7->loc).field_1.field_0.first_column);
LAB_0012d026:
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_c0.line._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.line._M_dataplus._M_p != &local_c0.line.field_2) {
          operator_delete(local_c0.line._M_dataplus._M_p);
        }
      }
      else if ((pEVar7->loc).field_1.field_1.offset != 0xffffffffffffffff) {
        StringPrintf_abi_cxx11_(&local_c0.line,"%07zx: ");
        goto LAB_0012d026;
      }
      std::__cxx11::string::append((char *)&local_68);
      if ((pEVar7->error_level != Warning) && (pEVar7->error_level != Error)) {
        abort();
      }
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)(pEVar7->message)._M_dataplus._M_p);
      cVar6 = (char)(string *)&local_68;
      std::__cxx11::string::push_back(cVar6);
      local_c0.line._M_dataplus._M_p = (pointer)&local_c0.line.field_2;
      local_c0.line._M_string_length = 0;
      local_c0.line.field_2._M_local_buf[0] = '\0';
      if (local_40 != (LexerSourceLineFinder *)0x0) {
        LexerSourceLineFinder::GetSourceLine(local_40,&pEVar7->loc,local_48,&local_c0);
      }
      if (local_c0.line._M_string_length != 0) {
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_c0.line._M_dataplus._M_p);
        std::__cxx11::string::push_back(cVar6);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
        iVar1 = (pEVar7->loc).field_1.field_0.first_column;
        iVar3 = ~local_c0.column_offset + iVar1;
        uVar4 = (long)(pEVar7->loc).field_1.field_0.last_column - (long)iVar1;
        uVar5 = local_c0.line._M_string_length - (long)iVar3;
        if (uVar4 <= uVar5) {
          uVar5 = uVar4;
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,(char)iVar3);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,(char)uVar5 + (uVar5 == 0))
        ;
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::string::push_back(cVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.line._M_dataplus._M_p != &local_c0.line.field_2) {
        operator_delete(local_c0.line._M_dataplus._M_p);
      }
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      std::__cxx11::string::_M_append((char *)local_98,(ulong)local_68);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      pEVar7 = pEVar7 + 1;
    } while (pEVar7 != local_38);
  }
  return local_98;
}

Assistant:

std::string FormatErrorsToString(const Errors& errors,
                                 Location::Type location_type,
                                 LexerSourceLineFinder* line_finder,
                                 const Color& color,
                                 const std::string& header,
                                 PrintHeader print_header,
                                 int source_line_max_length) {
  std::string result;
  for (const auto& error : errors) {
    if (!header.empty()) {
      switch (print_header) {
        case PrintHeader::Never:
          break;
        case PrintHeader::Once:
          print_header = PrintHeader::Never;
          // Fallthrough.
        case PrintHeader::Always:
          result += header;
          result += ":\n";
          break;
      }
    }

    int indent = header.empty() ? 0 : 2;

    result += FormatError(error, location_type, color, line_finder,
                          source_line_max_length, indent);
  }
  return result;
}